

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O3

AutoFile * __thiscall
node::BlockManager::OpenUndoFile
          (AutoFile *__return_storage_ptr__,BlockManager *this,FlatFilePos *pos,bool fReadOnly)

{
  long lVar1;
  vector<std::byte,_std::allocator<std::byte>_> data_xor;
  FILE *file;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffffb8;
  pointer in_stack_ffffffffffffffc0;
  pointer in_stack_ffffffffffffffc8;
  pointer local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  file = FlatFileSeq::Open(&this->m_undo_file_seq,pos,fReadOnly);
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)&stack0xffffffffffffffc0,
             &this->m_xor_key);
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffffc0;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffffb8;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffffc8;
  AutoFile::AutoFile(__return_storage_ptr__,file,data_xor);
  if (in_stack_ffffffffffffffc0 != (pointer)0x0) {
    operator_delete(in_stack_ffffffffffffffc0,(long)local_30 - (long)in_stack_ffffffffffffffc0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

AutoFile BlockManager::OpenUndoFile(const FlatFilePos& pos, bool fReadOnly) const
{
    return AutoFile{m_undo_file_seq.Open(pos, fReadOnly), m_xor_key};
}